

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Value * __thiscall
GlobOpt::GetIntConstantValue(GlobOpt *this,int32 intConst,Instr *instr,Opnd *opnd)

{
  Opnd *instr_00;
  int32 intConst_00;
  bool bVar1;
  ValueNumber VVar2;
  ValueNumber VVar3;
  Value **ppVVar4;
  ValueInfo *pVVar5;
  GlobOptBlockData *pGVar6;
  Value *pVVar7;
  int local_54;
  Value *pVStack_50;
  int32 symStoreIntConstantValue;
  Value *symStoreValue;
  Sym *symStore;
  Value *local_38;
  Value *cachedValue;
  Value *value;
  Opnd *opnd_local;
  Instr *instr_local;
  GlobOpt *pGStack_10;
  int32 intConst_local;
  GlobOpt *this_local;
  
  cachedValue = (Value *)0x0;
  symStore = (Sym *)0x0;
  value = (Value *)opnd;
  opnd_local = (Opnd *)instr;
  instr_local._4_4_ = intConst;
  pGStack_10 = this;
  ppVVar4 = JsUtil::
            BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Lookup(this->intConstantToValueMap,(int *)((long)&instr_local + 4),(Value **)&symStore
                    );
  local_38 = *ppVVar4;
  if (local_38 != (Value *)0x0) {
    pVVar5 = ::Value::GetValueInfo(local_38);
    symStoreValue = (Value *)ValueInfo::GetSymStore(pVVar5);
    if ((Sym *)symStoreValue != (Sym *)0x0) {
      pGVar6 = CurrentBlockData(this);
      bVar1 = GlobOptBlockData::IsLive(pGVar6,(Sym *)symStoreValue);
      if (bVar1) {
        pGVar6 = CurrentBlockData(this);
        pVStack_50 = GlobOptBlockData::FindValue(pGVar6,(Sym *)symStoreValue);
        if (pVStack_50 != (Value *)0x0) {
          VVar2 = ::Value::GetValueNumber(pVStack_50);
          VVar3 = ::Value::GetValueNumber(local_38);
          if (VVar2 == VVar3) {
            pVVar5 = ::Value::GetValueInfo(pVStack_50);
            bVar1 = ValueInfo::TryGetIntConstantValue(pVVar5,&local_54,false);
            if ((bVar1) && (local_54 == instr_local._4_4_)) {
              cachedValue = pVStack_50;
            }
          }
        }
      }
    }
  }
  intConst_00 = instr_local._4_4_;
  instr_00 = opnd_local;
  if (cachedValue == (Value *)0x0) {
    bVar1 = Js::TaggedInt::IsOverflow(instr_local._4_4_);
    cachedValue = NewIntConstantValue(this,intConst_00,(Instr *)instr_00,(bool)((bVar1 ^ 0xffU) & 1)
                                     );
  }
  pGVar6 = CurrentBlockData(this);
  pVVar7 = GlobOptBlockData::InsertNewValue(pGVar6,cachedValue,(Opnd *)value);
  return pVVar7;
}

Assistant:

Value *
GlobOpt::GetIntConstantValue(const int32 intConst, IR::Instr * instr, IR::Opnd *const opnd)
{
    Value *value = nullptr;
    Value *const cachedValue = this->intConstantToValueMap->Lookup(intConst, nullptr);

    if(cachedValue)
    {
        // The cached value could be from a different block since this is a global (as opposed to a per-block) cache. Since
        // values are cloned for each block, we can't use the same value object. We also can't have two values with the same
        // number in one block, so we can't simply copy the cached value either. And finally, there is no deterministic and fast
        // way to determine if a value with the same value number exists for this block. So the best we can do with a global
        // cache is to check the sym-store's value in the current block to see if it has a value with the same number.
        // Otherwise, we have to create a new value with a new value number.
        Sym *const symStore = cachedValue->GetValueInfo()->GetSymStore();
        if (symStore && CurrentBlockData()->IsLive(symStore))
        {

            Value *const symStoreValue = CurrentBlockData()->FindValue(symStore);
            int32 symStoreIntConstantValue;
            if (symStoreValue &&
                symStoreValue->GetValueNumber() == cachedValue->GetValueNumber() &&
                symStoreValue->GetValueInfo()->TryGetIntConstantValue(&symStoreIntConstantValue) &&
                symStoreIntConstantValue == intConst)
            {
                value = symStoreValue;
            }
        }
    }

    if (!value)
    {
        value = NewIntConstantValue(intConst, instr, !Js::TaggedInt::IsOverflow(intConst));
    }

    return CurrentBlockData()->InsertNewValue(value, opnd);
}